

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__textureRECT
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar1;
  bool bVar2;
  undefined8 in_RAX;
  byte *pbVar3;
  StringHash SVar4;
  uint64 uVar5;
  int iVar6;
  xmlChar **ppxVar7;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  pbVar3[0] = 0;
  pbVar3[1] = 0;
  pbVar3[2] = 0;
  pbVar3[3] = 0;
  pbVar3[4] = 0;
  pbVar3[5] = 0;
  pbVar3[6] = 0;
  pbVar3[7] = 0;
  pbVar3[8] = 0;
  pbVar3[9] = 0;
  pbVar3[10] = 0;
  pbVar3[0xb] = 0;
  pbVar3[0xc] = 0;
  pbVar3[0xd] = 0;
  pbVar3[0xe] = 0;
  pbVar3[0xf] = 0;
  *attributeDataPtr = pbVar3;
  ppxVar7 = attributes->attributes;
  if (ppxVar7 != (xmlChar **)0x0) {
    do {
      text = *ppxVar7;
      if (text == (ParserChar *)0x0) {
        iVar6 = 3;
      }
      else {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        additionalText = ppxVar7[1];
        ppxVar7 = ppxVar7 + 2;
        if (SVar4 == 0x704ac8) {
          uVar5 = GeneratedSaxParser::Utils::toUint64(additionalText,(bool *)((long)&uStack_38 + 7))
          ;
          *(uint64 *)(pbVar3 + 8) = uVar5;
          if (uStack_38._7_1_ == '\x01') {
            bVar2 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0xcf0a634,0x704ac8,additionalText);
            if (!bVar1) goto LAB_006c341a;
            iVar6 = 1;
          }
          else {
LAB_006c341a:
            iVar6 = 4;
            bVar2 = true;
            if (uStack_38._7_1_ == '\0') {
              *pbVar3 = *pbVar3 | 1;
            }
          }
          if (!bVar2) goto LAB_006c3410;
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0xcf0a634,text,additionalText);
          iVar6 = 1;
          if (bVar2) goto LAB_006c3410;
        }
        iVar6 = 0;
      }
LAB_006c3410:
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      return false;
    }
  }
  if (((*pbVar3 & 1) == 0) &&
     (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0xcf0a634,0x704ac8,(ParserChar *)0x0),
     bVar2)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__textureRECT( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__textureRECT( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

textureRECT__AttributeData* attributeData = newData<textureRECT__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURERECT,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= textureRECT__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_TEXTURERECT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( (attributeData->present_attributes & textureRECT__AttributeData::ATTRIBUTE_INDEX_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_TEXTURERECT, HASH_ATTRIBUTE_index, 0 ) )
        return false;
}


    return true;
}